

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scala_file.hpp
# Opt level: O2

void __thiscall scala::scale::scale(scale *this)

{
  value_type *__x;
  
  (this->degrees).super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->degrees).super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->degrees).super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (value_type *)operator_new(8);
  __x->ratio = 1.0;
  std::vector<scala::degree,_std::allocator<scala::degree>_>::push_back(&this->degrees,__x);
  return;
}

Assistant:

scale () {
            // The first degree is a scala file is always implicit. Make it explicit.
            degrees.push_back( *(new degree(0.0)));
        }